

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void * raviX_ptrlist_delete_last(PtrList **self)

{
  ushort uVar1;
  PtrList *pPVar2;
  PtrList *pPVar3;
  void *pvVar4;
  
  pPVar2 = *self;
  if (pPVar2 == (PtrList *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pPVar3 = pPVar2->prev_;
    uVar1 = *(ushort *)pPVar3;
    if ((char)uVar1 == '\0') {
      pvVar4 = (void *)0x0;
    }
    else {
      *(ushort *)pPVar3 = uVar1 & 0xff00 | uVar1 - 1 & 0xff;
      pvVar4 = pPVar3->list_[(char)(uVar1 - 1)];
    }
    if (*(char *)pPVar3 < '\x01') {
      pPVar2->prev_ = pPVar3->prev_;
      pPVar3->prev_->next_ = pPVar2;
      if (pPVar3 == pPVar2) {
        *self = (PtrList *)0x0;
      }
      (*pPVar3->allocator_->free)(pPVar3->allocator_->arena,pPVar3);
    }
  }
  return pvVar4;
}

Assistant:

void *raviX_ptrlist_delete_last(PtrList **self)
{
	void *ptr = NULL;
	PtrList *last, *first = *self;

	if (!first)
		return NULL;
	last = first->prev_;
	if (last->nr_)
		ptr = last->list_[--last->nr_];
	if (last->nr_ <= 0) {
		first->prev_ = last->prev_;
		last->prev_->next_ = first;
		if (last == first)
			*self = NULL;
		C_MemoryAllocator *alloc = last->allocator_;
		alloc->free(alloc->arena, last);
	}
	return ptr;
}